

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  sexp_conflict sexp_termios_type_obj;
  sexp_conflict sexp_winsize_type_obj;
  int **local_90;
  undefined8 local_88;
  int *local_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  long local_48;
  long local_40;
  char *local_38;
  char *local_30;
  undefined8 local_28;
  long local_10;
  
  local_50 = 0x43e;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  memset(&local_60,0,0x10);
  local_68 = 0x43e;
  memset(&local_78,0,0x10);
  local_80 = (int *)0x43e;
  memset(&local_90,0,0x10);
  iVar1 = strcmp(local_30,"0.11.0");
  if ((iVar1 == 0) && (iVar1 = strncmp(local_38,"cv-gm*uh",8), iVar1 == 0)) {
    local_60 = &local_50;
    local_58 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_60;
    local_78 = &local_68;
    local_70 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_78;
    local_90 = &local_80;
    local_88 = *(undefined8 *)(local_10 + 0x6080);
    *(int ****)(local_10 + 0x6080) = &local_90;
    local_50 = sexp_intern(local_10,"winsize",0xffffffffffffffff);
    local_40 = sexp_env_ref(local_10,local_28,local_50,0x3e);
    if (local_40 == 0x3e) {
      sexp_warn(local_10,"couldn\'t import declared type: ",local_50);
    }
    local_50 = sexp_intern(local_10,"termios",0xffffffffffffffff);
    local_48 = sexp_env_ref(local_10,local_28,local_50,0x3e);
    if (local_48 == 0x3e) {
      sexp_warn(local_10,"couldn\'t import declared type: ",local_50);
    }
    local_80 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"login-tty",1,0,"sexp_login_tty_stub",
                                 sexp_login_tty_stub,0);
    if ((((ulong)local_80 & 3) == 0) && (*local_80 == 0x1b)) {
      local_80[10] = 5;
      local_80[0xb] = 0;
      local_80[0xc] = 0x25;
      local_80[0xd] = 0;
    }
    local_80 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"forkpty",2,1,"sexp_forkpty_stub",
                                 sexp_forkpty_stub,0x3e);
    if ((((ulong)local_80 & 3) == 0) && (*local_80 == 0x1b)) {
      local_80[10] = 5;
      local_80[0xb] = 0;
      local_80[0xc] = 0x25;
      local_80[0xd] = 0;
      local_80[0xe] = 9;
      local_80[0xf] = 0;
      *(ulong *)(local_80 + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      uVar2 = sexp_make_vector_op(local_10,0,2,3,1);
      *(undefined8 *)(local_80 + 0x12) = uVar2;
      *(ulong *)(*(long *)(local_80 + 0x12) + 0x10) = (ulong)*(uint *)(local_40 + 0x50) << 1 | 1;
    }
    local_80 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"openpty",2,1,"sexp_openpty_stub",
                                 sexp_openpty_stub,0x3e);
    if ((((ulong)local_80 & 3) == 0) && (*local_80 == 0x1b)) {
      local_80[10] = 1;
      local_80[0xb] = 0;
      local_80[0xc] = 0x25;
      local_80[0xd] = 0;
      local_80[0xe] = 0x25;
      local_80[0xf] = 0;
      local_80[0x10] = 9;
      local_80[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_80 + 0x12) = uVar2;
      *(ulong *)(*(long *)(local_80 + 0x12) + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      *(ulong *)(*(long *)(local_80 + 0x12) + 0x18) = (ulong)*(uint *)(local_40 + 0x50) << 1 | 1;
    }
    *(undefined8 *)(local_10 + 0x6080) = local_58;
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_winsize_type_obj;
  sexp sexp_termios_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "winsize", -1);
  sexp_winsize_type_obj = sexp_env_ref(ctx, env, name, SEXP_FALSE);
  if (sexp_not(sexp_winsize_type_obj)) {
    sexp_warn(ctx, "couldn't import declared type: ", name);
  }
  name = sexp_intern(ctx, "termios", -1);
  sexp_termios_type_obj = sexp_env_ref(ctx, env, name, SEXP_FALSE);
  if (sexp_not(sexp_termios_type_obj)) {
    sexp_warn(ctx, "couldn't import declared type: ", name);
  }
  op = sexp_define_foreign(ctx, env, "login-tty", 1, sexp_login_tty_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
  }
  op = sexp_define_foreign_opt(ctx, env, "forkpty", 2, sexp_forkpty_stub, SEXP_FALSE);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_CHAR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_ONE, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj)));
  }
  op = sexp_define_foreign_opt(ctx, env, "openpty", 2, sexp_openpty_stub, SEXP_FALSE);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_CHAR);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj)));
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}